

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# changesoplex.hpp
# Opt level: O0

void __thiscall
soplex::SPxSolverBase<double>::changeRhsStatus
          (SPxSolverBase<double> *this,int i,double newRhs,double oldRhs)

{
  SPxSolverBase<double> *pSVar1;
  bool bVar2;
  Representation RVar3;
  Status SVar4;
  double *pdVar5;
  element_type *peVar6;
  string *m;
  SPxSolverBase<double> *in_RDI;
  SPxSolverBase<double> *in_XMM0_Qa;
  double dVar7;
  double in_XMM1_Qa;
  double objChange;
  double currLhs;
  Status *stat;
  double in_stack_ffffffffffffff18;
  int iVar8;
  SPxLPBase<double> *in_stack_ffffffffffffff20;
  allocator *this_00;
  SPxSolverBase<double> *in_stack_ffffffffffffff38;
  SPxSolverBase<double> *in_stack_ffffffffffffff40;
  SPxBasisBase<double> *in_stack_ffffffffffffff48;
  allocator local_59;
  string local_58 [32];
  double local_38;
  double local_30;
  Status *local_28;
  double local_20;
  SPxSolverBase<double> *local_18;
  int local_c [3];
  
  local_20 = in_XMM1_Qa;
  local_18 = in_XMM0_Qa;
  SPxBasisBase<double>::desc(&in_RDI->super_SPxBasisBase<double>);
  local_28 = SPxBasisBase<double>::Desc::rowStatus
                       ((Desc *)in_stack_ffffffffffffff20,
                        (int)((ulong)in_stack_ffffffffffffff18 >> 0x20));
  pdVar5 = SPxLPBase<double>::lhs
                     (in_stack_ffffffffffffff20,(int)((ulong)in_stack_ffffffffffffff18 >> 0x20));
  local_30 = *pdVar5;
  local_38 = 0.0;
  SPxOut::
  debug<soplex::SPxSolverBase<double>,_const_char_(&)[41],_int_&,_soplex::SPxBasisBase<double>::Desc::Status_&,_0>
            (in_RDI,(char (*) [41])"DCHANG04 changeRhsStatus()  : row {}: {}",local_c,local_28);
  pSVar1 = local_18;
  switch(*local_28) {
  case D_FREE:
  case D_ON_UPPER:
  case D_ON_LOWER:
  case D_ON_BOTH:
  case D_UNDEFINED:
    RVar3 = rep(in_RDI);
    if ((RVar3 == ROW) && (0.0 < in_RDI->theShift)) {
      forceRecompNonbasicValue(in_RDI);
    }
    SVar4 = SPxBasisBase<double>::dualRowStatus
                      (in_stack_ffffffffffffff48,(int)((ulong)in_stack_ffffffffffffff40 >> 0x20));
    *local_28 = SVar4;
    break;
  case P_FIXED:
    tolerances(in_RDI);
    peVar6 = std::__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x250a6b);
    Tolerances::epsilon(peVar6);
    bVar2 = NE<double,double,double>
                      ((double)in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
                       1.19935769505206e-317);
    iVar8 = (int)((ulong)in_stack_ffffffffffffff18 >> 0x20);
    in_stack_ffffffffffffff38 = local_18;
    if (bVar2) {
      *local_28 = P_ON_LOWER;
      bVar2 = isInitialized(in_RDI);
      in_stack_ffffffffffffff38 = local_18;
      if (bVar2) {
        pdVar5 = SPxLPBase<double>::maxRowObj(in_stack_ffffffffffffff20,iVar8);
        dVar7 = *pdVar5;
        pdVar5 = VectorBase<double>::operator[]
                           ((VectorBase<double> *)in_stack_ffffffffffffff20,iVar8);
        *pdVar5 = dVar7;
        in_stack_ffffffffffffff38 = local_18;
      }
    }
    break;
  default:
    m = (string *)__cxa_allocate_exception(0x28);
    this_00 = &local_59;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_58,"XCHANG04 This should never happen.",this_00);
    SPxInternalCodeException::SPxInternalCodeException((SPxInternalCodeException *)this_00,m);
    __cxa_throw(m,&SPxInternalCodeException::typeinfo,
                SPxInternalCodeException::~SPxInternalCodeException);
  case P_ON_LOWER:
    tolerances(in_RDI);
    peVar6 = std::__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x250982);
    Tolerances::epsilon(peVar6);
    bVar2 = EQ<double,double,double>
                      ((double)in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
                       1.19924257775658e-317);
    if (bVar2) {
      *local_28 = P_FIXED;
    }
    break;
  case P_ON_UPPER:
    pdVar5 = (double *)infinity();
    dVar7 = local_30;
    if ((double)pSVar1 < *pdVar5) {
      tolerances(in_RDI);
      peVar6 = std::
               __shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x25086e);
      Tolerances::epsilon(peVar6);
      bVar2 = EQ<double,double,double>
                        ((double)in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
                         1.19910621563833e-317);
      iVar8 = (int)((ulong)in_stack_ffffffffffffff18 >> 0x20);
      if (bVar2) {
        *local_28 = P_FIXED;
        if (((in_RDI->m_nonbasicValueUpToDate & 1U) != 0) && (RVar3 = rep(in_RDI), RVar3 == COLUMN))
        {
          pdVar5 = SPxLPBase<double>::maxRowObj(in_stack_ffffffffffffff20,iVar8);
          local_38 = *pdVar5 * ((double)local_18 - local_20);
        }
      }
      else if (((in_RDI->m_nonbasicValueUpToDate & 1U) != 0) &&
              (RVar3 = rep(in_RDI), RVar3 == COLUMN)) {
        pdVar5 = VectorBase<double>::operator[]
                           ((VectorBase<double> *)in_stack_ffffffffffffff20,iVar8);
        local_38 = *pdVar5 * ((double)local_18 - local_20);
      }
    }
    else {
      pdVar5 = (double *)infinity();
      iVar8 = (int)((ulong)in_stack_ffffffffffffff18 >> 0x20);
      if (-*pdVar5 < dVar7) {
        *local_28 = P_ON_LOWER;
        if (((in_RDI->m_nonbasicValueUpToDate & 1U) != 0) && (RVar3 = rep(in_RDI), RVar3 == COLUMN))
        {
          pdVar5 = VectorBase<double>::operator[]
                             ((VectorBase<double> *)in_stack_ffffffffffffff20,iVar8);
          dVar7 = *pdVar5 * local_30;
          pdVar5 = VectorBase<double>::operator[]
                             ((VectorBase<double> *)in_stack_ffffffffffffff20,iVar8);
          local_38 = dVar7 - *pdVar5 * local_20;
        }
      }
      else {
        *local_28 = P_FREE;
        if (((in_RDI->m_nonbasicValueUpToDate & 1U) != 0) && (RVar3 = rep(in_RDI), RVar3 == COLUMN))
        {
          pdVar5 = VectorBase<double>::operator[]
                             ((VectorBase<double> *)in_stack_ffffffffffffff20,iVar8);
          local_38 = -*pdVar5 * local_20;
        }
      }
    }
    break;
  case P_FREE:
    in_stack_ffffffffffffff40 = local_18;
    pdVar5 = (double *)infinity();
    iVar8 = (int)((ulong)in_stack_ffffffffffffff18 >> 0x20);
    if ((((double)in_stack_ffffffffffffff40 < *pdVar5) &&
        (*local_28 = P_ON_UPPER, (in_RDI->m_nonbasicValueUpToDate & 1U) != 0)) &&
       (RVar3 = rep(in_RDI), RVar3 == COLUMN)) {
      pdVar5 = VectorBase<double>::operator[]((VectorBase<double> *)in_stack_ffffffffffffff20,iVar8)
      ;
      local_38 = *pdVar5 * (double)local_18;
    }
  }
  SPxOut::
  debug<soplex::SPxSolverBase<double>,_const_char_(&)[8],_soplex::SPxBasisBase<double>::Desc::Status_&,_0>
            (in_RDI,(char (*) [8])0x489331,local_28);
  RVar3 = rep(in_RDI);
  if (RVar3 == COLUMN) {
    updateNonbasicValue(in_stack_ffffffffffffff40,(double)in_stack_ffffffffffffff38);
  }
  return;
}

Assistant:

void SPxSolverBase<R>::changeRhsStatus(int i, R newRhs, R oldRhs)
{
   typename SPxBasisBase<R>::Desc::Status& stat      = this->desc().rowStatus(i);
   R                    currLhs   = this->lhs(i);
   R                    objChange = 0.0;

   SPxOut::debug(this, "DCHANG04 changeRhsStatus()  : row {}: {}", i, stat);

   switch(stat)
   {
   case SPxBasisBase<R>::Desc::P_ON_UPPER:
      if(newRhs >= R(infinity))
      {
         if(currLhs <= R(-infinity))
         {
            stat = SPxBasisBase<R>::Desc::P_FREE;

            if(m_nonbasicValueUpToDate && rep() == COLUMN)
               objChange = -theLRbound[i] * oldRhs;
         }
         else
         {
            stat = SPxBasisBase<R>::Desc::P_ON_LOWER;

            if(m_nonbasicValueUpToDate && rep() == COLUMN)
               objChange = (theURbound[i] * currLhs) - (theLRbound[i] * oldRhs);
         }
      }
      else if(EQ(newRhs, currLhs, this->tolerances()->epsilon()))
      {
         stat = SPxBasisBase<R>::Desc::P_FIXED;

         if(m_nonbasicValueUpToDate && rep() == COLUMN)
            objChange = this->maxRowObj(i) * (newRhs - oldRhs);
      }
      else if(m_nonbasicValueUpToDate && rep() == COLUMN)
         objChange = theLRbound[i] * (newRhs - oldRhs);

      break;

   case SPxBasisBase<R>::Desc::P_ON_LOWER:
      if(EQ(newRhs, currLhs, this->tolerances()->epsilon()))
         stat = SPxBasisBase<R>::Desc::P_FIXED;

      break;

   case SPxBasisBase<R>::Desc::P_FREE:
      if(newRhs < R(infinity))
      {
         stat = SPxBasisBase<R>::Desc::P_ON_UPPER;

         if(m_nonbasicValueUpToDate && rep() == COLUMN)
            objChange = theLRbound[i] * newRhs;
      }

      break;

   case SPxBasisBase<R>::Desc::P_FIXED:
      if(NE(newRhs, currLhs, this->tolerances()->epsilon()))
      {
         stat = SPxBasisBase<R>::Desc::P_ON_LOWER;

         if(isInitialized())
            theURbound[i] = this->maxRowObj(i);
      }

      break;

   case SPxBasisBase<R>::Desc::D_FREE:
   case SPxBasisBase<R>::Desc::D_ON_UPPER:
   case SPxBasisBase<R>::Desc::D_ON_LOWER:
   case SPxBasisBase<R>::Desc::D_ON_BOTH:
   case SPxBasisBase<R>::Desc::D_UNDEFINED:
      if(rep() == ROW && theShift > 0.0)
         forceRecompNonbasicValue();

      stat = this->dualRowStatus(i);
      break;

   default:
      throw SPxInternalCodeException("XCHANG04 This should never happen.");
   }

   SPxOut::debug(this, " -> {}\n", stat);

   // we only need to update the nonbasic value in column representation (see nonbasicValue() for comparison/explanation)
   if(rep() == COLUMN)
      updateNonbasicValue(objChange);
}